

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_ExceptionValueFormat_Test::Body
          (iu_SyntaxTest_x_iutest_x_ExceptionValueFormat_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 extraout_RAX;
  float *pfVar2;
  AssertionResult *this_00;
  Fixed *fixed;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  AssertionResult iutest_ar;
  iuCodeMessage local_1d0;
  AssertionResult ar;
  
  paVar1 = &iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_result = true;
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  ExceptionFunction(5);
  pfVar2 = (float *)__cxa_begin_catch(extraout_RAX);
  if (extraout_EDX == 2) {
    iutest::internal::CmpHelperFloatingPointEQ<float>(&ar,"e","x",*pfVar2,0.1);
    if (ar.m_result != false) {
      std::__cxx11::string::~string((string *)&ar);
      __cxa_end_catch();
      std::__cxx11::string::~string((string *)&iutest_ar);
      iutest_ar.m_message._M_string_length = 0;
      iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
      iutest_ar.m_result = true;
      iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
      ExceptionFunction(5);
      std::__cxx11::string::~string((string *)&ar);
      __cxa_end_catch();
      std::__cxx11::string::~string((string *)&iutest_ar);
      _Unwind_Resume(extraout_RAX_00);
    }
    this_00 = iutest::AssertionResult::operator<<
                        (&iutest_ar,
                         (char (*) [62])
                         "\nExpected: ExceptionFunction(5) throws an exception of value\n");
    local_1d0.m_message._M_dataplus._M_p = ar.m_message._M_dataplus._M_p;
    iutest::AssertionResult::operator<<(this_00,(char **)&local_1d0);
    std::__cxx11::string::~string((string *)&ar);
    __cxa_end_catch();
  }
  else {
    iutest::AssertionResult::operator<<
              (&iutest_ar,
               (char (*) [105])
               "\nExpected: ExceptionFunction(5) throws an exception of type float.\n  Actual: it throws a different type."
              );
    __cxa_end_catch();
  }
  memset(&ar,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&ar);
  fixed = iutest::AssertionHelper::Fixed::operator<<((Fixed *)&ar,0.1);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1d0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x3a3,iutest_ar.m_message._M_dataplus._M_p);
  local_1d0._44_4_ = 2;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,fixed);
  std::__cxx11::string::~string((string *)&local_1d0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&ar);
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(SyntaxTest, GT)
{
    if( int x = 1 )
        IUTEST_ASSERT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_EXPECT_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_INFORM_GT(2, x) << x;
    if( int x = 1 )
        IUTEST_ASSUME_GT(2, x) << x;
}